

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

void Gia_ManHashResize(Gia_Man_t *p)

{
  int *__ptr;
  int iVar1;
  int iLit1;
  int iLitC;
  int iVar2;
  int *piVar3;
  uint local_7c;
  Gia_Obj_t *local_70;
  uint local_54;
  Gia_Obj_t *local_48;
  int local_3c;
  int i;
  int Counter2;
  int Counter;
  int iNext;
  int nHTableOld;
  int *pPlace;
  int *pHTableOld;
  Gia_Obj_t *pThis;
  Gia_Man_t *p_local;
  
  if (p->pHTable == (int *)0x0) {
    __assert_fail("p->pHTable != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                  ,0xa8,"void Gia_ManHashResize(Gia_Man_t *)");
  }
  __ptr = p->pHTable;
  iVar2 = p->nHTable;
  iVar1 = Gia_ManAndNum(p);
  iVar1 = Abc_PrimeCudd(iVar1 << 1);
  p->nHTable = iVar1;
  piVar3 = (int *)calloc((long)p->nHTable,4);
  p->pHTable = piVar3;
  i = 0;
  local_3c = 0;
  do {
    if (iVar2 <= local_3c) {
      iVar2 = Gia_ManAndNum(p);
      iVar1 = Gia_ManBufNum(p);
      if (i != iVar2 - iVar1) {
        __assert_fail("Counter == Counter2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                      ,0xbe,"void Gia_ManHashResize(Gia_Man_t *)");
      }
      if (__ptr != (int *)0x0) {
        free(__ptr);
      }
      return;
    }
    if (__ptr[local_3c] == 0) {
      local_48 = (Gia_Obj_t *)0x0;
    }
    else {
      iVar1 = Abc_Lit2Var(__ptr[local_3c]);
      local_48 = Gia_ManObj(p,iVar1);
    }
    pHTableOld = (int *)local_48;
    if (local_48 == (Gia_Obj_t *)0x0) {
      local_54 = 0;
    }
    else {
      local_54 = local_48->Value;
    }
    Counter2 = local_54;
    while (pHTableOld != (int *)0x0) {
      pHTableOld[2] = 0;
      iVar1 = Gia_ObjFaninLit0p(p,(Gia_Obj_t *)pHTableOld);
      iLit1 = Gia_ObjFaninLit1p(p,(Gia_Obj_t *)pHTableOld);
      iLitC = Gia_ObjFaninLit2p(p,(Gia_Obj_t *)pHTableOld);
      piVar3 = Gia_ManHashFind(p,iVar1,iLit1,iLitC);
      if (*piVar3 != 0) {
        __assert_fail("*pPlace == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                      ,0xb8,"void Gia_ManHashResize(Gia_Man_t *)");
      }
      iVar1 = Gia_ObjId(p,(Gia_Obj_t *)pHTableOld);
      iVar1 = Abc_Var2Lit(iVar1,0);
      *piVar3 = iVar1;
      if (*piVar3 == 0) {
        __assert_fail("*pPlace != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                      ,0xba,"void Gia_ManHashResize(Gia_Man_t *)");
      }
      i = i + 1;
      if (Counter2 == 0) {
        local_70 = (Gia_Obj_t *)0x0;
      }
      else {
        iVar1 = Abc_Lit2Var(Counter2);
        local_70 = Gia_ManObj(p,iVar1);
      }
      pHTableOld = (int *)local_70;
      if (local_70 == (Gia_Obj_t *)0x0) {
        local_7c = 0;
      }
      else {
        local_7c = local_70->Value;
      }
      Counter2 = local_7c;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void Gia_ManHashResize( Gia_Man_t * p )
{
    Gia_Obj_t * pThis;
    int * pHTableOld, * pPlace;
    int nHTableOld, iNext, Counter, Counter2, i;
    assert( p->pHTable != NULL );
    // replace the table
    pHTableOld = p->pHTable;
    nHTableOld = p->nHTable;
    p->nHTable = Abc_PrimeCudd( 2 * Gia_ManAndNum(p) ); 
    p->pHTable = ABC_CALLOC( int, p->nHTable );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nHTableOld; i++ )
    for ( pThis = (pHTableOld[i]? Gia_ManObj(p, Abc_Lit2Var(pHTableOld[i])) : NULL),
          iNext = (pThis? pThis->Value : 0);  
          pThis;  pThis = (iNext? Gia_ManObj(p, Abc_Lit2Var(iNext)) : NULL),   
          iNext = (pThis? pThis->Value : 0)  )
    {
        pThis->Value = 0;
        pPlace = Gia_ManHashFind( p, Gia_ObjFaninLit0p(p, pThis), Gia_ObjFaninLit1p(p, pThis), Gia_ObjFaninLit2p(p, pThis) );
        assert( *pPlace == 0 ); // should not be there
        *pPlace = Abc_Var2Lit( Gia_ObjId(p, pThis), 0 );
        assert( *pPlace != 0 );
        Counter++;
    }
    Counter2 = Gia_ManAndNum(p) - Gia_ManBufNum(p);
    assert( Counter == Counter2 );
    ABC_FREE( pHTableOld );
//    if ( p->fVerbose )
//        printf( "Resizing GIA hash table: %d -> %d.\n", nHTableOld, p->nHTable );
}